

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_conn_ev_data_detach(connectdata *conn,Curl_easy *data)

{
  Curl_easy *data_local;
  connectdata *conn_local;
  
  cf_cntrl_all(conn,data,true,2,0,(void *)0x0);
  return;
}

Assistant:

void Curl_conn_ev_data_detach(struct connectdata *conn,
                              struct Curl_easy *data)
{
  cf_cntrl_all(conn, data, TRUE, CF_CTRL_DATA_DETACH, 0, NULL);
}